

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_tests.cpp
# Opt level: O2

void __thiscall
iu_MatcherFailure_x_iutest_x_ContainerEq_Test::Body
          (iu_MatcherFailure_x_iutest_x_ContainerEq_Test *this)

{
  ScopedSPITestFlag SVar1;
  TestFlag *pTVar2;
  AssertionResult *in_R8;
  ScopedSPITestFlag guard;
  SPIFailureChecker iutest_failure_checker;
  AssertionResult iutest_spi_ar;
  string local_250;
  string local_230;
  AssertionResult iutest_ar;
  iuCodeMessage local_1e8;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [22];
  
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  local_1b8._0_8_ = &PTR__ContainerEqMatcher_002244c0;
  local_1b8._8_8_ = (anonymous_namespace)::gc;
  local_1a8._8_8_ = 0;
  local_198[0]._M_local_buf[0] = '\0';
  local_1a8._M_allocated_capacity = (size_type)local_198;
  iutest::detail::ContainerEqMatcher<int[3]>::operator()
            (&iutest_ar,(ContainerEqMatcher<int[3]> *)local_1b8,
             (int (*) [3])(anonymous_namespace)::gb);
  std::__cxx11::string::~string((string *)local_1a8._M_local_buf);
  if (iutest_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::PrintToString<int[3]>(&local_250,(int (*) [3])(anonymous_namespace)::gb);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_230,(detail *)local_250._M_dataplus._M_p,"ContainerEq(gc)",(char *)&iutest_ar,
               in_R8);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x27e,local_230._M_dataplus._M_p);
    local_1e8._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e8,(Fixed *)local_1b8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_250);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar1 = guard;
  pTVar2 = iutest::TestFlag::GetInstance();
  pTVar2->m_test_flags = (int)SVar1.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b8,"ContainerEq: { 1, 1, 1 }",(allocator<char> *)&local_1e8);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)local_1b8);
  std::__cxx11::string::~string((string *)local_1b8);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x27e,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)local_1b8);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  local_1b8._0_8_ = &PTR__ContainerEqMatcher_002244c0;
  local_1b8._8_8_ = (anonymous_namespace)::gc;
  local_1a8._8_8_ = 0;
  local_198[0]._M_local_buf[0] = '\0';
  local_1a8._M_allocated_capacity = (size_type)local_198;
  iutest::detail::ContainerEqMatcher<int[3]>::operator()
            (&iutest_ar,(ContainerEqMatcher<int[3]> *)local_1b8,
             (int (*) [3])(anonymous_namespace)::gb);
  std::__cxx11::string::~string((string *)local_1a8._M_local_buf);
  if (iutest_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::PrintToString<int[3]>(&local_250,(int (*) [3])(anonymous_namespace)::gb);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_230,(detail *)local_250._M_dataplus._M_p,"ContainerEq(gc)",(char *)&iutest_ar,
               in_R8);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x27f,local_230._M_dataplus._M_p);
    local_1e8._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e8,(Fixed *)local_1b8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_250);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar1 = guard;
  pTVar2 = iutest::TestFlag::GetInstance();
  pTVar2->m_test_flags = (int)SVar1.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b8,"Mismatch in a position 1: 1 vs 2",(allocator<char> *)&local_1e8);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)local_1b8);
  std::__cxx11::string::~string((string *)local_1b8);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x27f,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)local_1b8);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  local_1b8._0_8_ = &PTR__ContainerEqMatcher_002244c0;
  local_1b8._8_8_ = (anonymous_namespace)::gc;
  local_1a8._8_8_ = 0;
  local_198[0]._M_local_buf[0] = '\0';
  local_1a8._M_allocated_capacity = (size_type)local_198;
  iutest::detail::ContainerEqMatcher<int[3]>::operator()
            (&iutest_ar,(ContainerEqMatcher<int[3]> *)local_1b8,
             (int (*) [3])(anonymous_namespace)::gb);
  std::__cxx11::string::~string((string *)local_1a8._M_local_buf);
  if (iutest_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::PrintToString<int[3]>(&local_250,(int (*) [3])(anonymous_namespace)::gb);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_230,(detail *)local_250._M_dataplus._M_p,"ContainerEq(gc)",(char *)&iutest_ar,
               in_R8);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x280,local_230._M_dataplus._M_p);
    local_1e8._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e8,(Fixed *)local_1b8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_250);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar1 = guard;
  pTVar2 = iutest::TestFlag::GetInstance();
  pTVar2->m_test_flags = (int)SVar1.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b8,"Mismatch in a position 2: 1 vs 3",(allocator<char> *)&local_1e8);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)local_1b8);
  std::__cxx11::string::~string((string *)local_1b8);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x280,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)local_1b8);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  local_1b8._0_8_ = &PTR__ContainerEqMatcher_002244c0;
  local_1b8._8_8_ = (anonymous_namespace)::gc;
  local_1a8._8_8_ = 0;
  local_198[0]._M_local_buf[0] = '\0';
  local_1a8._M_allocated_capacity = (size_type)local_198;
  iutest::detail::ContainerEqMatcher<int[3]>::operator()
            (&iutest_ar,(ContainerEqMatcher<int[3]> *)local_1b8,
             (int (*) [10])(anonymous_namespace)::ga);
  std::__cxx11::string::~string((string *)local_1a8._M_local_buf);
  if (iutest_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::PrintToString<int[10]>(&local_250,(int (*) [10])(anonymous_namespace)::ga);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_230,(detail *)local_250._M_dataplus._M_p,"ContainerEq(gc)",(char *)&iutest_ar,
               in_R8);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x281,local_230._M_dataplus._M_p);
    local_1e8._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e8,(Fixed *)local_1b8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_250);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar1 = guard;
  pTVar2 = iutest::TestFlag::GetInstance();
  pTVar2->m_test_flags = (int)SVar1.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b8,"Mismatch element : 3 vs 10",(allocator<char> *)&local_1e8);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)local_1b8);
  std::__cxx11::string::~string((string *)local_1b8);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x281,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)local_1b8);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  local_1b8._0_8_ = &PTR__ContainerEqMatcher_00225f68;
  local_1b8._8_8_ = (anonymous_namespace)::ga;
  local_1a8._8_8_ = 0;
  local_198[0]._M_local_buf[0] = '\0';
  local_1a8._M_allocated_capacity = (size_type)local_198;
  iutest::detail::ContainerEqMatcher<int[10]>::operator()
            (&iutest_ar,(ContainerEqMatcher<int[10]> *)local_1b8,
             (int (*) [3])(anonymous_namespace)::gc);
  std::__cxx11::string::~string((string *)local_1a8._M_local_buf);
  if (iutest_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::PrintToString<int[3]>(&local_250,(int (*) [3])(anonymous_namespace)::gc);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_230,(detail *)local_250._M_dataplus._M_p,"ContainerEq(ga)",(char *)&iutest_ar,
               in_R8);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x282,local_230._M_dataplus._M_p);
    local_1e8._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e8,(Fixed *)local_1b8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_250);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  pTVar2 = iutest::TestFlag::GetInstance();
  pTVar2->m_test_flags = (int)guard.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b8,"Mismatch element : 10 vs 3",(allocator<char> *)&local_1e8);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)local_1b8);
  std::__cxx11::string::~string((string *)local_1b8);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x282,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)local_1b8);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  return;
}

Assistant:

IUTEST(MatcherFailure, ContainerEq)
{
    CHECK_FAILURE( IUTEST_ASSERT_THAT(gb, ContainerEq(gc)), "ContainerEq: { 1, 1, 1 }" );
    CHECK_FAILURE( IUTEST_ASSERT_THAT(gb, ContainerEq(gc)), "Mismatch in a position 1: 1 vs 2" );
    CHECK_FAILURE( IUTEST_ASSERT_THAT(gb, ContainerEq(gc)), "Mismatch in a position 2: 1 vs 3" );
    CHECK_FAILURE( IUTEST_ASSERT_THAT(ga, ContainerEq(gc)), "Mismatch element : 3 vs 10" );
    CHECK_FAILURE( IUTEST_ASSERT_THAT(gc, ContainerEq(ga)), "Mismatch element : 10 vs 3" );
}